

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1491_avgSalary.cpp
# Opt level: O2

double average(vector<int,_std::allocator<int>_> *salary)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  piVar2 = (salary->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(salary->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  dVar7 = 0.0;
  iVar4 = 1000;
  iVar5 = 1000000;
  for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
    iVar1 = piVar2[lVar6];
    dVar7 = dVar7 + (double)iVar1;
    if (iVar1 < iVar5) {
      iVar5 = iVar1;
    }
    if (iVar4 < iVar1) {
      iVar4 = iVar1;
    }
  }
  lVar3 = lVar3 + -2;
  auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar8._0_8_ = lVar3;
  auVar8._12_4_ = 0x45300000;
  return (dVar7 - (double)(iVar4 + iVar5)) /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
}

Assistant:

double average(vector<int>& salary) {
        int sal_min=1e6, sal_max=1e3;
        double net=0;
        for (int i=0; i<salary.size(); i++)
        {
        	net+=salary[i];
        	if (salary[i]<=sal_min)
        		sal_min=salary[i];
        	if (salary[i]>=sal_max)
        		sal_max=salary[i];
        }
        net-=(sal_max+sal_min);
        net/=(salary.size()-2);
        return net;
    }